

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O0

void __thiscall ktx::CommandInfo::executeInfo(CommandInfo *this)

{
  int iVar1;
  string_view filepath;
  char *pcVar2;
  long in_RDI;
  ktx_error_code_e result;
  InputStream inputStream;
  InputStream *in_stack_fffffffffffffba0;
  size_t in_stack_fffffffffffffbf0;
  char **in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  char (*in_stack_fffffffffffffc18) [37];
  ReturnCode in_stack_fffffffffffffc24;
  Reporter *in_stack_fffffffffffffc28;
  ktx_error_code_e local_3c4;
  Reporter *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffc78;
  InputStream *in_stack_fffffffffffffc80;
  istream *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  istream *in_stack_ffffffffffffff08;
  CommandInfo *in_stack_ffffffffffffff10;
  
  InputStream::InputStream
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  iVar1 = *(int *)(in_RDI + 0x48);
  if (iVar1 == 0) {
    InputStream::operator_cast_to_istream_((InputStream *)&stack0xfffffffffffffc40);
    local_3c4 = printInfoText((CommandInfo *)
                              CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                              in_stack_fffffffffffffef8);
  }
  else if (iVar1 == 1) {
    InputStream::operator_cast_to_istream_((InputStream *)&stack0xfffffffffffffc40);
    local_3c4 = printInfoJSON(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                              (bool)in_stack_ffffffffffffff07);
  }
  else {
    if (iVar1 != 2) {
      __assert_fail("false && \"Internal error\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_info.cpp"
                    ,0x7e,"void ktx::CommandInfo::executeInfo()");
    }
    InputStream::operator_cast_to_istream_((InputStream *)&stack0xfffffffffffffc40);
    local_3c4 = printInfoJSON(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                              (bool)in_stack_ffffffffffffff07);
  }
  if (local_3c4 != KTX_SUCCESS) {
    pcVar2 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view
                               ((string *)(in_RDI + 0x50));
    filepath._M_str = pcVar2;
    filepath._M_len = in_stack_fffffffffffffbf0;
    fmtInFile_abi_cxx11_(filepath);
    in_stack_fffffffffffffba0 = (InputStream *)ktxErrorString(local_3c4);
    Reporter::fatal<char_const(&)[37],std::__cxx11::string,char_const*>
              (in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,in_stack_fffffffffffffc18,
               in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc08);
  }
  InputStream::~InputStream(in_stack_fffffffffffffba0);
  return;
}

Assistant:

void CommandInfo::executeInfo() {
    InputStream inputStream(options.inputFilepath, *this);

    KTX_error_code result;

    switch (options.format) {
    case OutputFormat::text:
        result = printInfoText(inputStream);
        break;
    case OutputFormat::json:
        result = printInfoJSON(inputStream, false);
        break;
    case OutputFormat::json_mini:
        result = printInfoJSON(inputStream, true);
        break;
    default:
        assert(false && "Internal error");
        return;
    }

    if (result != KTX_SUCCESS)
        fatal(rc::INVALID_FILE, "Failed to process KTX2 file \"{}\": {}", fmtInFile(options.inputFilepath), ktxErrorString(result));
}